

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O3

streamsize __thiscall
fmt::v6::internal::formatbuf<char>::xsputn(formatbuf<char> *this,char *s,streamsize count)

{
  buffer<char> *pbVar1;
  ptrdiff_t _Num;
  ulong uVar2;
  
  pbVar1 = this->buffer_;
  uVar2 = pbVar1->size_ + count;
  if (pbVar1->capacity_ < uVar2) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar2);
  }
  if (count != 0) {
    memmove(pbVar1->ptr_ + pbVar1->size_,s,count);
  }
  pbVar1->size_ = uVar2;
  return count;
}

Assistant:

std::streamsize xsputn(const Char* s, std::streamsize count) FMT_OVERRIDE {
    buffer_.append(s, s + count);
    return count;
  }